

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssutil.cpp
# Opt level: O3

bool paintsOver(BorderStyle *styles,QBrush *colors,Edge e1,Edge e2)

{
  BorderStyle BVar1;
  BorderStyle BVar2;
  bool bVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QColor local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  BVar1 = styles[e2];
  bVar4 = true;
  if (BVar1 != BorderStyle_None) {
    BVar2 = styles[e1];
    QColor::QColor(&local_48,transparent);
    bVar3 = QBrush::doCompareEqualColor(colors + e2,local_48);
    if (!bVar3) {
      if (BVar1 == BorderStyle_Solid && BVar2 == BorderStyle_Solid) {
        bVar3 = QBrush::operator==(colors + e1,colors + e2);
        if (bVar3) {
          bVar3 = QBrush::isOpaque(colors + e1);
          if (bVar3) goto LAB_005d65eb;
        }
      }
      bVar4 = false;
    }
  }
LAB_005d65eb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

static bool paintsOver(const QCss::BorderStyle *styles, const QBrush *colors, QCss::Edge e1, QCss::Edge e2)
{
    QCss::BorderStyle s1 = styles[e1];
    QCss::BorderStyle s2 = styles[e2];

    if (s2 == BorderStyle_None || colors[e2] == Qt::transparent)
        return true;

    if ((s1 == BorderStyle_Solid && s2 == BorderStyle_Solid) && (colors[e1] == colors[e2])
            && colors[e1].isOpaque()) {
        return true;
    }

    return false;
}